

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

void __thiscall
CompositedBupOutputter::newMouth
          (CompositedBupOutputter *this,Image *img,Point pos,int num,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  vector<MaskRect,_std::allocator<MaskRect>_> *this_00;
  char *in_RDI;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_00000008;
  Image *in_stack_00000010;
  Image *in_stack_00000018;
  Point in_stack_00000020;
  Image *in_stack_ffffffffffffff18;
  Image *in_stack_ffffffffffffff20;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  Image::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::operator+(in_stack_ffffffffffffff48,in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff6c);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  this_01 = local_48;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd0),this_01);
  std::__cxx11::string::~string(this_01);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  this_00 = (vector<MaskRect,_std::allocator<MaskRect>_> *)(in_RDI + 0xb0);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            (in_stack_ffffffffffffff70,
             (vector<MaskRect,_std::allocator<MaskRect>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  Image::drawOnto(in_stack_00000018,in_stack_00000010,in_stack_00000020,in_stack_00000008);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector(this_00);
  return;
}

Assistant:

void newMouth(const Image& img, Point pos, int num, const std::vector<MaskRect>& mask) override {
		withMouth = withFace;
		withMouthName = withFaceName + "_" + std::to_string(num);
		img.drawOnto(withMouth, pos, mask);
	}